

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestCharReaderFailIfExtraTestcommentAfterObject::runTestCase
          (TestCharReaderFailIfExtraTestcommentAfterObject *this)

{
  TestResult *pTVar1;
  int iVar2;
  Value *pVVar3;
  CharReader *pCVar4;
  string errs;
  Value root;
  char doc [47];
  CharReaderBuilder b;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  string local_150;
  string local_130;
  Value local_110;
  char local_e8 [56];
  CharReaderBuilder local_b0;
  Value local_80;
  Value local_58;
  
  Json::CharReaderBuilder::CharReaderBuilder(&local_b0);
  Json::Value::Value(&local_110,nullValue);
  builtin_strncpy(local_e8 + 0x10,"value\" } //trailing\n//comment\n",0x1f);
  builtin_strncpy(local_e8,"{ \"property\" : \"",0x10);
  Json::Value::Value(&local_58,true);
  pVVar3 = Json::Value::operator[](&local_b0.settings_,"failIfExtra");
  Json::Value::operator=(pVVar3,&local_58);
  Json::Value::~Value(&local_58);
  pCVar4 = Json::CharReaderBuilder::newCharReader(&local_b0);
  local_168 = 0;
  local_160[0] = 0;
  local_170 = local_160;
  iVar2 = (*pCVar4->_vptr_CharReader[2])(pCVar4,local_e8,local_e8 + 0x2e,&local_110,&local_170);
  if ((char)iVar2 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderFailIfExtraTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x7c8,"ok");
  }
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_170,local_170 + local_168);
  JsonTest::checkStringEqual
            (pTVar1,&local_130,&local_150,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7c9,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  pVVar3 = Json::Value::operator[](&local_110,"property");
  Json::Value::Value(&local_80,pVVar3);
  JsonTest::checkEqual<char_const*,Json::Value>
            (pTVar1,"value",&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7ca,"\"value\" == root[\"property\"]");
  Json::Value::~Value(&local_80);
  (*pCVar4->_vptr_CharReader[1])(pCVar4);
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  Json::Value::~Value(&local_110);
  Json::CharReaderBuilder::~CharReaderBuilder(&local_b0);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, commentAfterObject) {
  Json::CharReaderBuilder b;
  Json::Value root;
  {
  char const doc[] =
      "{ \"property\" : \"value\" } //trailing\n//comment\n";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT_STRING_EQUAL("", errs);
  JSONTEST_ASSERT_EQUAL("value", root["property"]);
  delete reader;
  }
}